

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O1

int Kit_TruthIsop2(uint *puTruth0,uint *puTruth1,int nVars,Vec_Int_t *vMemory,int fTryBoth,
                  int fReturnTt)

{
  Kit_Sop_t *pKVar1;
  Kit_Sop_t *pKVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  uint *__src;
  ulong uVar6;
  int nWords;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Kit_Sop_t cRes;
  Kit_Sop_t cRes2;
  Kit_Sop_t local_58;
  int local_44;
  Kit_Sop_t local_40;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x3d,
                  "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)");
  }
  vMemory->nSize = 0;
  if (vMemory->nCap < 0x100000) {
    if (vMemory->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(0x400000);
    }
    else {
      piVar4 = (int *)realloc(vMemory->pArray,0x400000);
    }
    vMemory->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMemory->nCap = 0x100000;
  }
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = 1;
  }
  uVar7 = (ulong)uVar8;
  lVar5 = uVar7 + 1;
  do {
    puTruth0[lVar5 + -2] = ~puTruth0[lVar5 + -2];
    lVar5 = lVar5 + -1;
  } while (1 < lVar5);
  local_44 = fTryBoth;
  __src = Kit_TruthIsop_rec(puTruth1,puTruth0,nVars,&local_58,vMemory);
  lVar5 = uVar7 + 1;
  do {
    puTruth0[lVar5 + -2] = ~puTruth0[lVar5 + -2];
    lVar5 = lVar5 + -1;
  } while (1 < lVar5);
  uVar3 = uVar7;
  if (local_58.nCubes == 0xffffffff) {
    uVar8 = 0xffffffff;
    iVar9 = -1;
    goto LAB_005d6977;
  }
  do {
    uVar6 = uVar3;
    if ((long)uVar6 < 1) goto LAB_005d67b3;
    uVar3 = uVar6 - 1;
  } while ((puTruth1[uVar6 - 1] & ~__src[uVar6 - 1]) == 0);
  if (0 < (long)uVar6) {
    __assert_fail("Kit_TruthIsImply( puTruth1, pResult, nVars )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x4a,
                  "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)");
  }
LAB_005d67b3:
  lVar5 = uVar7 + 1;
  do {
    puTruth0[lVar5 + -2] = ~puTruth0[lVar5 + -2];
    lVar5 = lVar5 + -1;
    uVar3 = uVar7;
  } while (1 < lVar5);
  do {
    uVar6 = uVar3;
    if ((long)uVar6 < 1) goto LAB_005d67e9;
    uVar3 = uVar6 - 1;
  } while ((__src[uVar6 - 1] & ~puTruth0[uVar6 - 1]) == 0);
  if (0 < (long)uVar6) {
    __assert_fail("Kit_TruthIsImply( pResult, puTruth0, nVars )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x4c,
                  "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)");
  }
LAB_005d67e9:
  lVar5 = uVar7 + 1;
  do {
    puTruth0[lVar5 + -2] = ~puTruth0[lVar5 + -2];
    lVar5 = lVar5 + -1;
  } while (1 < lVar5);
  if ((local_58.nCubes == 0) || ((local_58.nCubes == 1 && (*local_58.pCubes == 0)))) {
    *vMemory->pArray = 0;
    iVar9 = 0;
    uVar8 = local_58.nCubes;
  }
  else {
    if (local_44 == 0) {
LAB_005d691f:
      pKVar1 = &local_58;
      pKVar2 = &local_58;
      iVar9 = 0;
    }
    else {
      lVar5 = uVar7 + 1;
      do {
        puTruth1[lVar5 + -2] = ~puTruth1[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
      __src = Kit_TruthIsop_rec(puTruth0,puTruth1,nVars,&local_40,vMemory);
      lVar5 = uVar7 + 1;
      do {
        puTruth1[lVar5 + -2] = ~puTruth1[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
      uVar3 = uVar7;
      if (local_40.nCubes < 0) goto LAB_005d691f;
      do {
        uVar6 = uVar3;
        if ((long)uVar6 < 1) goto LAB_005d688d;
        uVar3 = uVar6 - 1;
      } while ((puTruth0[uVar6 - 1] & ~__src[uVar6 - 1]) == 0);
      if (0 < (long)uVar6) {
        __assert_fail("Kit_TruthIsImply( puTruth0, pResult, nVars )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                      ,0x5c,
                      "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                     );
      }
LAB_005d688d:
      lVar5 = uVar7 + 1;
      do {
        puTruth1[lVar5 + -2] = ~puTruth1[lVar5 + -2];
        lVar5 = lVar5 + -1;
        uVar3 = uVar7;
      } while (1 < lVar5);
      do {
        uVar6 = uVar3;
        if ((long)uVar6 < 1) goto LAB_005d68c3;
        uVar3 = uVar6 - 1;
      } while ((__src[uVar6 - 1] & ~puTruth1[uVar6 - 1]) == 0);
      if (0 < (long)uVar6) {
        __assert_fail("Kit_TruthIsImply( pResult, puTruth1, nVars )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                      ,0x5e,
                      "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                     );
      }
LAB_005d68c3:
      lVar5 = uVar7 + 1;
      do {
        puTruth1[lVar5 + -2] = ~puTruth1[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
      pKVar1 = &local_40;
      if ((local_58.nCubes <= local_40.nCubes) &&
         ((local_58.nCubes != local_40.nCubes || (local_58.nLits <= local_40.nLits))))
      goto LAB_005d691f;
      iVar9 = 1;
      pKVar2 = &local_40;
    }
    if (fReturnTt != 0) {
      memmove(vMemory->pArray,__src,uVar7 << 2);
      if ((int)uVar8 <= vMemory->nSize) goto LAB_005d6977;
      goto LAB_005d6940;
    }
    uVar8 = pKVar1->nCubes;
    memmove(vMemory->pArray,pKVar2->pCubes,(long)(int)uVar8 << 2);
  }
  if ((int)uVar8 <= vMemory->nSize) {
LAB_005d6977:
    vMemory->nSize = uVar8;
    return iVar9;
  }
LAB_005d6940:
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Kit_TruthIsop2( unsigned * puTruth0, unsigned * puTruth1, int nVars, Vec_Int_t * vMemory, int fTryBoth, int fReturnTt )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    pResult = Kit_TruthIsop_rec( puTruth1, puTruth0, nVars, pcRes, vMemory );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsImply( puTruth1, pResult, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    assert( Kit_TruthIsImply( pResult, puTruth0, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        pResult = Kit_TruthIsop_rec( puTruth0, puTruth1, nVars, pcRes2, vMemory );
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsImply( puTruth0, pResult, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            assert( Kit_TruthIsImply( pResult, puTruth1, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    if ( fReturnTt )
    {
        int nWords = Kit_TruthWordNum( nVars );
        memmove( vMemory->pArray, pResult, nWords * sizeof(unsigned) );
        Vec_IntShrink( vMemory, nWords );
    }
    else
    {
        memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
        Vec_IntShrink( vMemory, pcRes->nCubes );
    }
    return RetValue;
}